

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
TempBanIRCCommand::trigger
          (TempBanIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  string_view name;
  string_view name_00;
  char *begin;
  undefined8 uVar1;
  PlayerInfo *pPVar2;
  seconds sVar3;
  size_t sVar4;
  char *pcVar5;
  player_search_result pVar6;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> dVar7;
  player_search_result pVar8;
  string banner;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  size_t local_a0;
  jessilib *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  size_t local_68;
  char *local_60;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_58;
  
  sVar3.__r = pluginInstance.m_defaultTempBanTime.__r;
  pcVar5 = nick._M_str;
  local_68 = nick._M_len;
  if (parameters._M_len == 0) {
    Jupiter::IRC::Client::sendNotice
              (source,local_68,pcVar5,0x47,
               "Error: Too Few Parameters. Syntax: TempBan [Duration] <Player> [Reason]");
    return;
  }
  local_60 = pcVar5;
  jessilib::
  word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
            (&local_58,(jessilib *)parameters._M_str,parameters._M_str + parameters._M_len," \t","",
             pcVar5);
  begin = local_58.first._M_str;
  sVar4 = local_58.first._M_len;
  name._M_str = local_58.first._M_str;
  name._M_len = local_58.first._M_len;
  local_a0 = local_58.second._M_len;
  local_98 = (jessilib *)local_58.second._M_str;
  pVar6 = findPlayerByPartName(source,channel,name);
  pPVar2 = pVar6.player;
  if (pPVar2 == (PlayerInfo *)0x0 && pVar6.server != (Server *)0x0) {
    if (local_58.second._M_len == 0) {
      pPVar2 = (PlayerInfo *)0x0;
    }
    else {
      dVar7 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (begin,(char *)(sVar4 + (long)begin));
      sVar3.__r = (rep)dVar7.duration.__r;
      if (0 < sVar3.__r) {
        jessilib::
        word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)&local_88,(jessilib *)local_58.second._M_str,
                   (char *)(local_58.second._M_str + local_58.second._M_len)," \t","",pcVar5);
        local_58.first._M_len = (size_t)local_88._M_dataplus._M_p;
        local_58.first._M_str = (char *)local_88._M_string_length;
        local_58.second._M_len = local_88.field_2._M_allocated_capacity;
        local_58.second._M_str = (char *)local_88.field_2._8_8_;
        if (pluginInstance.m_maxTempBanTime.__r < sVar3.__r) {
          sVar3 = pluginInstance.m_maxTempBanTime;
        }
        name_00._M_str = (char *)local_88._M_string_length;
        name_00._M_len = (size_t)local_88._M_dataplus._M_p;
        local_a0 = local_88.field_2._M_allocated_capacity;
        local_98 = (jessilib *)local_88.field_2._8_8_;
        pVar8 = findPlayerByPartName(source,channel,name_00);
        goto LAB_0012b4e8;
      }
      pPVar2 = (PlayerInfo *)0x0;
    }
  }
  pVar8.player = pPVar2;
  pVar8.server = pVar6.server;
LAB_0012b4e8:
  if (pVar8.server == (Server *)0x0) {
    pcVar5 = "Error: Channel not attached to any connected Renegade X servers.";
    uVar1 = 0x40;
  }
  else {
    if (pVar8.player != (PlayerInfo *)0x0) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,local_60,local_60 + local_68);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_88,"@IRC");
      if (local_a0 == 0) {
        local_98 = (jessilib *)0x13bb6f;
      }
      sVar4 = 9;
      if (local_a0 != 0) {
        sVar4 = local_a0;
      }
      RenX::Server::banPlayer
                (pVar8.server,pVar8.player,local_88._M_string_length,local_88._M_dataplus._M_p,sVar4
                 ,local_98,sVar3.__r);
      Jupiter::IRC::Client::sendMessage(source,channel._M_len,channel._M_str,0xe,"Player banned.");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p == &local_88.field_2) {
        return;
      }
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      return;
    }
    pcVar5 = "Error: Could not find player.";
    uVar1 = 0x1d;
  }
  Jupiter::IRC::Client::sendMessage(source,channel._M_len,channel._M_str,uVar1,pcVar5);
  return;
}

Assistant:

void TempBanIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (parameters.empty()) {
		source->sendNotice(nick, "Error: Too Few Parameters. Syntax: TempBan [Duration] <Player> [Reason]"sv);
		return;
	}

	std::chrono::seconds duration = pluginInstance.getDefaultTBanTime();
	auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	std::string_view name = command_split.first;
	std::string_view reason = command_split.second;

	// Try searching by name first
	auto search_result = findPlayerByPartName(source, channel, name);
	if (search_result.server != nullptr
		&& search_result.player == nullptr
		&& !command_split.second.empty()) {
		// Try reading token as a duration instead, and search the name token if duration > 0
		duration = jessilib::duration_from_string(name.data(), name.data() + name.size()).duration;
		if (duration.count() > 0) {
			// It reads as a duration; sanity check & try searching again
			command_split = jessilib::word_split_once_view(command_split.second, WHITESPACE_SV);
			duration = std::min(duration, pluginInstance.getMaxTBanTime());
			name = command_split.first;
			reason = command_split.second;
			search_result = findPlayerByPartName(source, channel, name);
		}
	}

	if (search_result.server == nullptr) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	if (search_result.player == nullptr) {
		source->sendMessage(channel, "Error: Could not find player."sv);
		return;
	}

	if (reason.empty()) {
		reason = "No reason"sv;
	}

	std::string banner{ nick };
	banner += "@IRC";
	search_result.server->banPlayer(*search_result.player, banner, reason, duration);
	source->sendMessage(channel, "Player banned."sv);
}